

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.h
# Opt level: O2

void __thiscall
gmlc::networking::SocketFactory::SocketFactory(SocketFactory *this,string *conf,bool is_file)

{
  undefined3 in_register_00000011;
  string *conf_str;
  string local_50;
  string local_30;
  
  (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<gmlc::networking::SocketFactory>)._M_weak_this.
  super___weak_ptr<gmlc::networking::SocketFactory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->encrypted = false;
  this->handshake_server = false;
  if (CONCAT31(in_register_00000011,is_file) == 0) {
    conf_str = &local_50;
    std::__cxx11::string::string
              ((string *)conf_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)conf);
    parse_json_config(this,conf_str);
  }
  else {
    conf_str = &local_30;
    std::__cxx11::string::string
              ((string *)conf_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)conf);
    load_json_config_file(this,conf_str);
  }
  std::__cxx11::string::~string((string *)conf_str);
  return;
}

Assistant:

SocketFactory(const std::string& conf, bool is_file = true)
    {
        if (is_file) {
            load_json_config_file(conf);
        } else {
            parse_json_config(conf);
        }
    }